

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int xmlDelEncodingAlias(char *alias)

{
  xmlCharEncodingAliasPtr pxVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  pxVar1 = xmlCharEncodingAliases;
  if (xmlCharEncodingAliases != (xmlCharEncodingAliasPtr)0x0 && alias != (char *)0x0) {
    uVar5 = 0;
    uVar3 = (ulong)(uint)xmlCharEncodingAliasesNb;
    if (xmlCharEncodingAliasesNb < 1) {
      uVar3 = uVar5;
    }
    lVar4 = 8;
    for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      iVar2 = strcmp(*(char **)((long)&pxVar1->name + lVar4),alias);
      if (iVar2 == 0) {
        (*xmlFree)(*(void **)((long)pxVar1 + lVar4 + -8));
        (*xmlFree)(*(void **)((long)&xmlCharEncodingAliases->name + lVar4));
        xmlCharEncodingAliasesNb = xmlCharEncodingAliasesNb + -1;
        memmove((void *)((long)xmlCharEncodingAliases + lVar4 + -8),
                (void *)((long)&xmlCharEncodingAliases->alias + lVar4),
                ((long)xmlCharEncodingAliasesNb - uVar5) * 0x10);
        return 0;
      }
      lVar4 = lVar4 + 0x10;
    }
  }
  return -1;
}

Assistant:

int
xmlDelEncodingAlias(const char *alias) {
    int i;

    if (alias == NULL)
	return(-1);

    if (xmlCharEncodingAliases == NULL)
	return(-1);
    /*
     * Walk down the list looking for a definition of the alias
     */
    for (i = 0;i < xmlCharEncodingAliasesNb;i++) {
	if (!strcmp(xmlCharEncodingAliases[i].alias, alias)) {
	    xmlFree((char *) xmlCharEncodingAliases[i].name);
	    xmlFree((char *) xmlCharEncodingAliases[i].alias);
	    xmlCharEncodingAliasesNb--;
	    memmove(&xmlCharEncodingAliases[i], &xmlCharEncodingAliases[i + 1],
		    sizeof(xmlCharEncodingAlias) * (xmlCharEncodingAliasesNb - i));
	    return(0);
	}
    }
    return(-1);
}